

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlFeatureSetting::DebugXmlFeatures(GdlFeatureSetting *this,ofstream *strmOut,string *staPathToCur)

{
  ostream *poVar1;
  GrpLineAndFile lnf;
  string sStack_88;
  undefined1 local_68 [40];
  string local_40;
  
  GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)local_68,(GrpLineAndFile *)this);
  poVar1 = std::operator<<((ostream *)strmOut,"      <featureSetting name=\"");
  std::__cxx11::string::string((string *)&sStack_88,(string *)&this->m_staName);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
  poVar1 = std::operator<<(poVar1,"\" value=\"");
  std::ostream::operator<<(poVar1,this->m_nValue);
  std::__cxx11::string::~string((string *)&sStack_88);
  if (local_68._0_4_ != -1) {
    poVar1 = std::operator<<((ostream *)strmOut,"\" inFile=\"");
    std::__cxx11::string::string((string *)&local_40,(string *)staPathToCur);
    GrpLineAndFile::FileWithPath(&sStack_88,(GrpLineAndFile *)local_68,&local_40);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
    poVar1 = std::operator<<(poVar1,"\" atLine=\"");
    std::ostream::operator<<(poVar1,local_68._4_4_);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<((ostream *)strmOut,"\" />\n");
  std::__cxx11::string::~string((string *)(local_68 + 8));
  return;
}

Assistant:

void GdlFeatureSetting::DebugXmlFeatures(std::ofstream & strmOut, std::string staPathToCur)
{
	GrpLineAndFile lnf = this->LineAndFile();
	strmOut << "      <featureSetting name=\"" << this->Name()
		<< "\" value=\"" << this->Value();

	if (!lnf.NotSet())
		strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
			<< "\" atLine=\"" << lnf.OriginalLine();

	strmOut << "\" />\n";
}